

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

prod_bitset * __thiscall
CppGenerator::computeDependentLoops
          (prod_bitset *__return_storage_ptr__,CppGenerator *this,size_t view_id,
          prod_bitset presentFunctions,var_bitset relationBag,dyn_bitset *contributingViews,
          var_bitset varOrderBitset,dyn_bitset *addedOutLoops,size_t thisLoopID)

{
  ulong *puVar1;
  ulong *puVar2;
  pointer pDVar3;
  pointer pdVar4;
  pointer puVar5;
  iterator __position;
  unsigned_long *puVar6;
  iterator iVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  var_bitset varOrderBitset_00;
  var_bitset varOrderBitset_01;
  var_bitset relationBag_00;
  unsigned_long uVar11;
  dyn_bitset *pdVar12;
  bool bVar13;
  size_t sVar14;
  vector<DependentLoop,_std::allocator<DependentLoop>_> *this_00;
  View *pVVar15;
  long lVar16;
  size_type sVar17;
  vector<std::pair<unsigned_long,std::bitset<1500ul>>,std::allocator<std::pair<unsigned_long,std::bitset<1500ul>>>>
  *this_01;
  size_t v;
  ulong uVar18;
  long lVar19;
  undefined8 *puVar20;
  undefined8 *puVar21;
  ulong uVar22;
  size_t incID;
  ulong v_id;
  _WordT _Var23;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *pdVar24;
  size_t *potNextLoop;
  ulong uVar25;
  unsigned_long *puVar26;
  bool bVar27;
  byte bVar28;
  var_bitset relationBag_01;
  size_t nextLoopID;
  dyn_bitset loopFactors;
  dyn_bitset nonAddedOutLoops;
  dyn_bitset nextLoops;
  dyn_bitset remainingLoops;
  dyn_bitset nextConsideredLoops;
  prod_bitset loopFunctionMask;
  _Base_bitset<24UL> in_stack_fffffffffffff8e8;
  unsigned_long local_620;
  long local_618;
  pointer local_610;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_608;
  Function *local_600;
  ulong local_5f8;
  long local_5f0;
  _WordT local_5e8;
  dyn_bitset *local_5e0;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_5d8;
  Function *local_5b8;
  _WordT local_5b0;
  prod_bitset *local_5a8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_5a0;
  ulong local_580;
  ulong local_578;
  dyn_bitset local_570;
  dyn_bitset local_550;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_530;
  DependentLoop local_510;
  _WordT local_3d8;
  _WordT _Stack_3d0;
  _WordT local_3c8;
  _WordT _Stack_3c0;
  dyn_bitset local_3b0;
  dyn_bitset local_390;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_370;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_350 [6];
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_290;
  ulong local_270 [24];
  undefined8 local_1b0 [24];
  undefined8 local_f0 [24];
  
  local_5b0 = relationBag.super__Base_bitset<2UL>._M_w[1];
  local_5b8 = relationBag.super__Base_bitset<2UL>._M_w[0];
  bVar28 = 0;
  local_610 = (pointer)view_id;
  local_5a8 = __return_storage_ptr__;
  sVar14 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_5d8,sVar14 + 1,0,(allocator<unsigned_long> *)&local_510);
  sVar14 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_530,sVar14 + 1,0,(allocator<unsigned_long> *)&local_510);
  memset(local_270,0,0xc0);
  pDVar3 = (this->depListOfLoops).super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_5f8 = QueryCompiler::numberOfViews
                        ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  local_618 = thisLoopID * 0x138;
  pdVar24 = &pDVar3[thisLoopID].loopFactors;
  if (local_5f8 != 0) {
    do {
      if (((pdVar24->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[local_5f8 >> 6] >> (local_5f8 & 0x3f) & 1) != 0)
      goto LAB_00258de9;
      local_5f8 = local_5f8 - 1;
    } while (local_5f8 != 0);
  }
  local_5f8 = 0;
LAB_00258de9:
  pdVar4 = (this->outViewLoop).
           super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_510,
             addedOutLoops);
  local_5f0 = (long)local_610 * 0x20;
  boost::operator&(&local_5a0,pdVar4 + (long)local_610,
                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_510);
  local_5e0 = contributingViews;
  if (local_510.functionMask.
      super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_510.functionMask.
                    super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  this_00 = &this->depListOfLoops;
  _Var23 = 0;
  local_608 = pdVar24;
  do {
    local_578 = _Var23 >> 6;
    local_580 = 1L << ((byte)_Var23 & 0x3f);
    if ((presentFunctions.super__Base_bitset<24UL>._M_w[local_578] >> (_Var23 & 0x3f) & 1) != 0) {
      local_600 = QueryCompiler::getFunction
                            ((this->_qc).
                             super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             _Var23);
      local_5e8 = _Var23;
      if (local_5d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start !=
          local_5d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_finish) {
        memset(local_5d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,0,
               (long)local_5d8.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_5d8.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start & 0xfffffffffffffff8);
      }
      uVar18 = 0;
      do {
        uVar22 = uVar18 >> 6;
        uVar25 = 1L << ((byte)uVar18 & 0x3f);
        if ((((local_600->_fVars).super__Base_bitset<2UL>._M_w[uVar22] >> (uVar18 & 0x3f) & 1) != 0)
           && ((varOrderBitset.super__Base_bitset<2UL>._M_w[uVar22] & uVar25) == 0)) {
          if (((ulong)(&local_5b8)[uVar22] & uVar25) == 0) {
            for (v_id = 0;
                sVar14 = QueryCompiler::numberOfViews
                                   ((this->_qc).
                                    super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr), v_id < sVar14; v_id = v_id + 1) {
              bVar8 = (byte)v_id;
              if ((((local_5e0->m_bits).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[v_id >> 6] >> (v_id & 0x3f) & 1) != 0) &&
                 (pVVar15 = QueryCompiler::getView
                                      ((this->_qc).
                                       super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,v_id),
                 ((pVVar15->_fVars).super__Base_bitset<2UL>._M_w[uVar22] & uVar25) != 0)) {
                uVar22 = (v_id >> 6) << 3;
                goto LAB_00258f53;
              }
            }
          }
          else {
            sVar14 = QueryCompiler::numberOfViews
                               ((this->_qc).
                                super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               );
            bVar8 = (byte)sVar14;
            uVar22 = sVar14 >> 3 & 0xfffffffffffffff8;
LAB_00258f53:
            *(ulong *)(uVar22 + (long)local_5d8.m_bits.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start) =
                 *(ulong *)(uVar22 + (long)local_5d8.m_bits.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start) |
                 1L << (bVar8 & 0x3f);
          }
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != 100);
      boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_510,
                       &local_5d8,&local_5a0);
      _Var23 = local_5e8;
      pdVar24 = local_608;
      lVar16 = (long)local_510.functionMask.
                     super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_510.functionMask.
                     super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      bVar27 = lVar16 != 0;
      if (lVar16 == 0) {
LAB_00259053:
        if (bVar27) goto LAB_0025905b;
        lVar16 = (long)local_5a0.m_bits.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_5a0.m_bits.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
        bVar27 = lVar16 != 0;
        if (lVar16 == 0) {
LAB_00259167:
          if (bVar27) goto LAB_0025916f;
          bVar13 = false;
          bVar27 = false;
        }
        else {
          uVar18 = lVar16 >> 3;
          if (*local_5a0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start == 0) {
            uVar22 = 1;
            do {
              uVar25 = uVar22;
              if (uVar18 + (uVar18 == 0) == uVar25) break;
              uVar22 = uVar25 + 1;
            } while (local_5a0.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar25] == 0);
            bVar27 = uVar25 < uVar18;
            goto LAB_00259167;
          }
LAB_0025916f:
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                    (&local_290,
                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     ((long)&(((this->outViewLoop).
                               super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_bits).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl + local_5f0));
          boost::operator&(&local_370,&local_5d8,&local_290);
          lVar16 = (long)local_370.m_bits.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_370.m_bits.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
          bVar27 = lVar16 != 0;
          if (lVar16 == 0) {
            bVar13 = true;
          }
          else {
            uVar18 = lVar16 >> 3;
            bVar13 = true;
            if (*local_370.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start == 0) {
              uVar22 = 1;
              do {
                uVar25 = uVar22;
                if (uVar18 + (uVar18 == 0) == uVar25) break;
                uVar22 = uVar25 + 1;
              } while (local_370.m_bits.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar25] == 0);
              bVar27 = uVar25 < uVar18;
            }
            else {
              bVar27 = true;
            }
          }
        }
      }
      else {
        uVar18 = lVar16 >> 3;
        if ((local_510.functionMask.
             super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first == 0) {
          uVar22 = 1;
          do {
            uVar25 = uVar22;
            if (uVar18 + (uVar18 == 0) == uVar25) break;
            uVar22 = uVar25 + 1;
          } while (((local_510.functionMask.
                     super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super__Base_bitset<24UL>.
                   _M_w[uVar25 - 1] == 0);
          bVar27 = uVar25 < uVar18;
          goto LAB_00259053;
        }
LAB_0025905b:
        bVar27 = true;
        bVar13 = false;
      }
      if (bVar13) {
        if (local_370.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_370.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_290.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_290.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if (local_510.functionMask.
          super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_510.functionMask.
                        super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (!bVar27) {
        if ((long)local_5d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_5d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0) {
          lVar16 = (long)local_5d8.m_bits.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_5d8.m_bits.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          puVar5 = (addedOutLoops->m_bits).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar19 = 0;
          do {
            local_5d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar19] =
                 local_5d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar19] | puVar5[lVar19];
            lVar19 = lVar19 + 1;
          } while (lVar16 + (ulong)(lVar16 == 0) != lVar19);
        }
        bVar27 = boost::operator==(&local_5d8,pdVar24);
        if (bVar27) {
          local_270[local_578] = local_270[local_578] | local_580;
        }
        else {
          boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &local_510,pdVar24,&local_5d8);
          bVar27 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                      *)&local_510,pdVar24);
          if (local_510.functionMask.
              super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_510.functionMask.
                            super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (bVar27) {
            boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                      (local_350,pdVar24);
            boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &local_510,&local_5d8,local_350);
            if (local_350[0].m_bits.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_350[0].m_bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            lVar16 = (long)local_510.functionMask.
                           super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_510.functionMask.
                           super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            bVar27 = lVar16 != 0;
            if (lVar16 == 0) {
LAB_002592a9:
              if (bVar27) goto LAB_002592ad;
            }
            else {
              uVar18 = lVar16 >> 3;
              if ((local_510.functionMask.
                   super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first == 0) {
                uVar22 = 1;
                do {
                  uVar25 = uVar22;
                  if (uVar18 + (uVar18 == 0) == uVar25) break;
                  uVar22 = uVar25 + 1;
                } while (((local_510.functionMask.
                           super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->second).
                         super__Base_bitset<24UL>._M_w[uVar25 - 1] == 0);
                bVar27 = uVar25 < uVar18;
                goto LAB_002592a9;
              }
LAB_002592ad:
              sVar17 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                       find_next((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &local_510,local_5f8);
              if (sVar17 == 0xffffffffffffffff) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"We found a remaining Loop which is not higher ",
                           0x2e);
                std::operator<<((ostream *)&std::cerr," than the highest considered loop?!\n");
                goto LAB_00259cb5;
              }
              local_530.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[sVar17 >> 6] =
                   local_530.m_bits.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar17 >> 6] | 1L << ((byte)sVar17 & 0x3f);
            }
            if (local_510.functionMask.
                super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_510.functionMask.
                              super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
          }
        }
      }
    }
    _Var23 = _Var23 + 1;
  } while (_Var23 != 0x5dc);
  memcpy(&local_510,local_270,0xc0);
  lVar16 = 0;
  do {
    uVar9 = *(uint *)((long)local_510.branchFunctions.super__Base_bitset<24UL>._M_w +
                     lVar16 * 8 + -0x74);
    _Var23 = local_510.branchFunctions.super__Base_bitset<24UL>._M_w[lVar16 + -0xe];
    uVar10 = *(uint *)((long)local_510.branchFunctions.super__Base_bitset<24UL>._M_w +
                      lVar16 * 8 + -0x6c);
    *(uint *)(local_510.branchFunctions.super__Base_bitset<24UL>._M_w + lVar16 + -0xf) =
         (uint)local_510.branchFunctions.super__Base_bitset<24UL>._M_w[lVar16 + -0xf] ^ 0xffffffff;
    *(uint *)((long)local_510.branchFunctions.super__Base_bitset<24UL>._M_w + lVar16 * 8 + -0x74) =
         uVar9 ^ 0xffffffff;
    *(uint *)(local_510.branchFunctions.super__Base_bitset<24UL>._M_w + lVar16 + -0xe) =
         (uint)_Var23 ^ 0xffffffff;
    *(uint *)((long)local_510.branchFunctions.super__Base_bitset<24UL>._M_w + lVar16 * 8 + -0x6c) =
         uVar10 ^ 0xffffffff;
    lVar16 = lVar16 + 2;
  } while (lVar16 != 0x18);
  local_510.branchFunctions.super__Base_bitset<24UL>._M_w[8] =
       local_510.branchFunctions.super__Base_bitset<24UL>._M_w[8] & 0xfffffff;
  memcpy(local_350,&local_510,0xc0);
  lVar16 = 0;
  do {
    uVar18 = *(ulong *)((long)&local_350[0].m_bits.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish + lVar16 * 8);
    uVar22 = presentFunctions.super__Base_bitset<24UL>._M_w[lVar16 + 1];
    presentFunctions.super__Base_bitset<24UL>._M_w[lVar16] =
         presentFunctions.super__Base_bitset<24UL>._M_w[lVar16] &
         *(ulong *)((long)&local_350[0].m_bits.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + lVar16 * 8);
    presentFunctions.super__Base_bitset<24UL>._M_w[lVar16 + 1] = uVar22 & uVar18;
    lVar16 = lVar16 + 2;
  } while (lVar16 != 0x18);
  this_01 = (vector<std::pair<unsigned_long,std::bitset<1500ul>>,std::allocator<std::pair<unsigned_long,std::bitset<1500ul>>>>
             *)((long)(((this_00->super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>)
                        ._M_impl.super__Vector_impl_data._M_start)->branchFunctions).
                      super__Base_bitset<24UL>._M_w + local_618 + -0x78);
  if (local_270[0] == 0) {
    uVar18 = 0xffffffffffffffff;
    do {
      if (uVar18 == 0x16) {
        uVar22 = 0x17;
        break;
      }
      uVar22 = uVar18 + 1;
      lVar16 = uVar18 + 2;
      uVar18 = uVar22;
    } while (local_270[lVar16] == 0);
    if (uVar22 < 0x17) goto LAB_0025940d;
  }
  else {
LAB_0025940d:
    local_510.functionMask.
    super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_610;
    memcpy(&local_510.functionMask.
            super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish,local_270,0xc0);
    __position._M_current = *(pair<unsigned_long,_std::bitset<1500UL>_> **)(this_01 + 8);
    if (__position._M_current == *(pair<unsigned_long,_std::bitset<1500UL>_> **)(this_01 + 0x10)) {
      std::
      vector<std::pair<unsigned_long,std::bitset<1500ul>>,std::allocator<std::pair<unsigned_long,std::bitset<1500ul>>>>
      ::_M_realloc_insert<std::pair<unsigned_long,std::bitset<1500ul>>>
                (this_01,__position,(pair<unsigned_long,_std::bitset<1500UL>_> *)&local_510);
    }
    else {
      memcpy(__position._M_current,&local_510,200);
      *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 200;
    }
  }
  local_600 = local_5b8;
  local_5e8 = local_5b0;
  for (uVar18 = 0;
      sVar14 = QueryCompiler::numberOfViews
                         ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr), pdVar24 = local_608, uVar18 < sVar14 + 1; uVar18 = uVar18 + 1) {
    uVar22 = 1L << ((byte)uVar18 & 0x3f);
    uVar25 = uVar18 >> 6;
    if ((local_530.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[uVar25] >> (uVar18 & 0x3f) & 1) != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_350[0].m_bits,&local_608->m_bits);
      local_350[0].m_num_bits = pdVar24->m_num_bits;
      local_350[0].m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar25] =
           local_350[0].m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar25] | uVar22;
      if ((*(ulong *)(*(long *)((long)&(((this->outViewLoop).
                                         super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->m_bits).
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl + local_5f0) + uVar25 * 8) & uVar22) != 0) {
        std::operator<<((ostream *)&std::cerr,
                        "THERE IS A MISTAKE WITH NEXT CONSIDERED LOOPS IN DEP COMP\n");
LAB_00259cb5:
        exit(1);
      }
      puVar26 = *(unsigned_long **)(this_01 + 0x18);
      puVar6 = *(unsigned_long **)(this_01 + 0x20);
      if (puVar26 == puVar6) {
LAB_00259585:
        local_620 = ((long)(this->depListOfLoops).
                           super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(this->depListOfLoops).
                           super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97;
        sVar14 = QueryCompiler::numberOfViews
                           ((this->_qc).
                            super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        DependentLoop::DependentLoop(&local_510,sVar14);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&local_510.loopFactors.m_bits,&local_350[0].m_bits);
        local_510.loopFactors.m_num_bits = local_350[0].m_num_bits;
        local_510.loopVariable = uVar18;
        std::vector<DependentLoop,_std::allocator<DependentLoop>_>::push_back(this_00,&local_510);
        pDVar3 = (this_00->super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        iVar7._M_current =
             *(unsigned_long **)
              ((long)(pDVar3->branchFunctions).super__Base_bitset<24UL>._M_w + local_618 + -0x58);
        if (iVar7._M_current ==
            *(unsigned_long **)
             ((long)(pDVar3->branchFunctions).super__Base_bitset<24UL>._M_w + local_618 + -0x50)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                     ((long)(pDVar3->branchFunctions).super__Base_bitset<24UL>._M_w +
                     local_618 + -0x60),iVar7,&local_620);
        }
        else {
          *iVar7._M_current = local_620;
          *(unsigned_long **)
           ((long)(pDVar3->branchFunctions).super__Base_bitset<24UL>._M_w + local_618 + -0x58) =
               iVar7._M_current + 1;
        }
        if (local_510.loopFactors.m_bits.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_510.loopFactors.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_510.outView.m_bits.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_510.outView.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_510.next.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_510.next.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_510.functionMask.
            super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_510.functionMask.
                          super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        bVar27 = false;
        do {
          bVar13 = boost::operator==(&(this_00->
                                      super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>
                                      )._M_impl.super__Vector_impl_data._M_start[*puVar26].
                                      loopFactors,local_350);
          if (bVar13) {
            local_620 = *puVar26;
            bVar27 = true;
          }
          puVar26 = puVar26 + 1;
        } while (puVar26 != puVar6);
        if (!bVar27) goto LAB_00259585;
      }
      memcpy(local_f0,&presentFunctions,0xc0);
      pdVar12 = local_5e0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_550.m_bits,&local_5e0->m_bits);
      local_550.m_num_bits = pdVar12->m_num_bits;
      local_3c8 = varOrderBitset.super__Base_bitset<2UL>._M_w[0];
      _Stack_3c0 = varOrderBitset.super__Base_bitset<2UL>._M_w[1];
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_390.m_bits,&addedOutLoops->m_bits);
      uVar11 = local_620;
      local_390.m_num_bits = addedOutLoops->m_num_bits;
      puVar20 = local_f0;
      puVar21 = (undefined8 *)&stack0xfffffffffffff8e8;
      for (lVar16 = 0x18; lVar16 != 0; lVar16 = lVar16 + -1) {
        *puVar21 = *puVar20;
        puVar20 = puVar20 + (ulong)bVar28 * -2 + 1;
        puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
      }
      varOrderBitset_00.super__Base_bitset<2UL>._M_w[1] = _Stack_3c0;
      varOrderBitset_00.super__Base_bitset<2UL>._M_w[0] = local_3c8;
      relationBag_01.super__Base_bitset<2UL>._M_w[1] = local_5e8;
      relationBag_01.super__Base_bitset<2UL>._M_w[0] = (_WordT)local_600;
      computeDependentLoops
                ((prod_bitset *)&local_510,this,(size_t)local_610,
                 (prod_bitset)in_stack_fffffffffffff8e8._M_w,relationBag_01,&local_550,
                 varOrderBitset_00,&local_390,uVar11);
      if (local_390.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_390.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_550.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_550.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pDVar3 = (this_00->super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar16 = 0;
      do {
        uVar22 = local_510.branchFunctions.super__Base_bitset<24UL>._M_w[lVar16 + -0xe];
        puVar2 = (ulong *)((long)(pDVar3->branchFunctions).super__Base_bitset<24UL>._M_w +
                          lVar16 * 8 + local_618 + 0x78 + -0x78);
        uVar25 = puVar2[1];
        puVar1 = (ulong *)((long)(pDVar3->branchFunctions).super__Base_bitset<24UL>._M_w +
                          lVar16 * 8 + local_618 + 0x78 + -0x78);
        *puVar1 = *puVar2 | local_510.branchFunctions.super__Base_bitset<24UL>._M_w[lVar16 + -0xf];
        puVar1[1] = uVar25 | uVar22;
        lVar16 = lVar16 + 2;
      } while (lVar16 != 0x18);
      if (local_350[0].m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_350[0].m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  bVar27 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                             ((long)&(((this->outViewLoop).
                                       super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_bits).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl + local_5f0),local_608);
  if (bVar27) {
    puVar2 = (ulong *)(*(long *)((long)(((this_00->
                                         super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->
                                       branchFunctions).super__Base_bitset<24UL>._M_w +
                                local_618 + -0x48) + ((ulong)local_610 >> 6) * 8);
    *puVar2 = *puVar2 | 1L << ((byte)local_610 & 0x3f);
  }
  bVar27 = boost::operator==(local_608,addedOutLoops);
  if (!bVar27) goto LAB_00259c25;
  lVar16 = (long)local_5a0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_5a0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  bVar27 = lVar16 != 0;
  if (lVar16 == 0) {
LAB_002598ce:
    if (!bVar27) goto LAB_00259c25;
  }
  else {
    uVar18 = lVar16 >> 3;
    if (*local_5a0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start == 0) {
      uVar22 = 1;
      do {
        uVar25 = uVar22;
        if (uVar18 + (uVar18 == 0) == uVar25) break;
        uVar22 = uVar25 + 1;
      } while (local_5a0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar25] == 0);
      bVar27 = uVar25 < uVar18;
      goto LAB_002598ce;
    }
  }
  sVar17 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                     (&local_5a0,0);
  pdVar24 = local_608;
  if (sVar17 == 0xffffffffffffffff) goto LAB_00259c25;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_350[0].m_bits,&local_608->m_bits);
  uVar18 = 1L << ((byte)sVar17 & 0x3f);
  local_350[0].m_num_bits = pdVar24->m_num_bits;
  local_600 = (Function *)(sVar17 >> 6);
  local_350[0].m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[(long)local_600] =
       local_350[0].m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_start[(long)local_600] | uVar18;
  puVar26 = *(unsigned_long **)(this_01 + 0x18);
  puVar6 = *(unsigned_long **)(this_01 + 0x20);
  if (puVar26 == puVar6) {
LAB_002599a3:
    local_620 = ((long)(this->depListOfLoops).
                       super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->depListOfLoops).
                       super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97;
    sVar14 = QueryCompiler::numberOfViews
                       ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
    DependentLoop::DependentLoop(&local_510,sVar14);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&local_510.loopFactors.m_bits,&local_350[0].m_bits);
    local_510.loopFactors.m_num_bits = local_350[0].m_num_bits;
    local_510.loopVariable = sVar17;
    std::vector<DependentLoop,_std::allocator<DependentLoop>_>::push_back(this_00,&local_510);
    pDVar3 = (this_00->super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar7._M_current =
         *(unsigned_long **)
          ((long)(pDVar3->branchFunctions).super__Base_bitset<24UL>._M_w + local_618 + -0x58);
    if (iVar7._M_current ==
        *(unsigned_long **)
         ((long)(pDVar3->branchFunctions).super__Base_bitset<24UL>._M_w + local_618 + -0x50)) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                 ((long)(pDVar3->branchFunctions).super__Base_bitset<24UL>._M_w + local_618 + -0x60)
                 ,iVar7,&local_620);
    }
    else {
      *iVar7._M_current = local_620;
      *(unsigned_long **)
       ((long)(pDVar3->branchFunctions).super__Base_bitset<24UL>._M_w + local_618 + -0x58) =
           iVar7._M_current + 1;
    }
    if (local_510.loopFactors.m_bits.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_510.loopFactors.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_510.outView.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_510.outView.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_510.next.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_510.next.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_510.functionMask.
        super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_510.functionMask.
                      super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar27 = false;
    do {
      bVar13 = boost::operator==(&(this_00->
                                  super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[*puVar26].loopFactors,
                                 local_350);
      if (bVar13) {
        local_620 = *puVar26;
        bVar27 = true;
      }
      puVar26 = puVar26 + 1;
    } while (puVar26 != puVar6);
    if (!bVar27) goto LAB_002599a3;
  }
  puVar2 = (addedOutLoops->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start + (long)local_600;
  *puVar2 = *puVar2 | uVar18;
  memcpy(local_1b0,&presentFunctions,0xc0);
  pdVar12 = local_5e0;
  relationBag_00.super__Base_bitset<2UL>._M_w[1] = local_5b0;
  relationBag_00.super__Base_bitset<2UL>._M_w[0] = (_WordT)local_5b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_570.m_bits,&local_5e0->m_bits);
  local_570.m_num_bits = pdVar12->m_num_bits;
  local_3d8 = varOrderBitset.super__Base_bitset<2UL>._M_w[0];
  _Stack_3d0 = varOrderBitset.super__Base_bitset<2UL>._M_w[1];
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_3b0.m_bits,&addedOutLoops->m_bits);
  uVar11 = local_620;
  local_3b0.m_num_bits = addedOutLoops->m_num_bits;
  puVar20 = local_1b0;
  puVar21 = (undefined8 *)&stack0xfffffffffffff8e8;
  for (lVar16 = 0x18; lVar16 != 0; lVar16 = lVar16 + -1) {
    *puVar21 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar28 * -2 + 1;
    puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
  }
  varOrderBitset_01.super__Base_bitset<2UL>._M_w[1] = _Stack_3d0;
  varOrderBitset_01.super__Base_bitset<2UL>._M_w[0] = local_3d8;
  computeDependentLoops
            ((prod_bitset *)&local_510,this,(size_t)local_610,
             (prod_bitset)in_stack_fffffffffffff8e8._M_w,relationBag_00,&local_570,varOrderBitset_01
             ,&local_3b0,uVar11);
  if (local_3b0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b0.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_570.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_570.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pDVar3 = (this_00->super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar16 = 0;
  do {
    uVar18 = local_510.branchFunctions.super__Base_bitset<24UL>._M_w[lVar16 + -0xe];
    puVar2 = (ulong *)((long)(pDVar3->branchFunctions).super__Base_bitset<24UL>._M_w +
                      lVar16 * 8 + local_618 + 0x78 + -0x78);
    uVar22 = puVar2[1];
    puVar1 = (ulong *)((long)(pDVar3->branchFunctions).super__Base_bitset<24UL>._M_w +
                      lVar16 * 8 + local_618 + 0x78 + -0x78);
    *puVar1 = *puVar2 | local_510.branchFunctions.super__Base_bitset<24UL>._M_w[lVar16 + -0xf];
    puVar1[1] = uVar22 | uVar18;
    lVar16 = lVar16 + 2;
  } while (lVar16 != 0x18);
  if (local_350[0].m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_350[0].m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00259c25:
  memcpy(local_5a8,
         (void *)((long)(((this_00->
                          super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>)._M_impl
                          .super__Vector_impl_data._M_start)->branchFunctions).
                        super__Base_bitset<24UL>._M_w + local_618),0xc0);
  if (local_5a0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5a0.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_530.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_530.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5d8.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return local_5a8;
}

Assistant:

prod_bitset CppGenerator::computeDependentLoops(
    size_t view_id, prod_bitset presentFunctions, var_bitset relationBag,
    dyn_bitset contributingViews, var_bitset varOrderBitset,
    dyn_bitset addedOutLoops, size_t thisLoopID)
{
    dyn_bitset loopFactors(_qc->numberOfViews()+1);
    dyn_bitset nextLoops(_qc->numberOfViews()+1);

    prod_bitset loopFunctionMask;

    const dyn_bitset& consideredLoops = depListOfLoops[thisLoopID].loopFactors;

    size_t highestPosition = 0;
    // need to continue with this the next loop
    for (size_t view=_qc->numberOfViews(); view > 0; view--)
    {
        if (consideredLoops[view])
        {
            highestPosition = view;
            break;
        }
    }

    
    dyn_bitset nonAddedOutLoops = outViewLoop[view_id] & ~addedOutLoops;

    // then find all loops required to compute these functions and create masks
    for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++)
    {
        if (presentFunctions[f])
        {
            const var_bitset& functionVars = _qc->getFunction(f)->_fVars;
            loopFactors.reset();
            
            for (size_t v = 0; v < NUM_OF_VARIABLES; ++v)
            {
                if (functionVars[v] && !varOrderBitset[v])
                {
                    if (relationBag[v])
                        loopFactors.set(_qc->numberOfViews());
                    else
                    {
                        for (size_t incID = 0; incID < _qc->numberOfViews(); ++incID)
                        {
                            if (contributingViews[incID])
                            {
                                View* incView = _qc->getView(incID);
                                const var_bitset& incViewBitset = incView->_fVars;
                                if (incViewBitset[v])
                                {
                                    loopFactors.set(incID);
                                    break;
                                }
                            }
                        }
                    }
                }
            }

            // TODO: TODO: Consider this again 
            if ((loopFactors & nonAddedOutLoops).any() ||
                (nonAddedOutLoops.any() && (loopFactors & ~outViewLoop[view_id]).any()))
                continue;
            
            loopFactors |= addedOutLoops;
            
            if (loopFactors == consideredLoops)
            {
                // Add this function to the mask for this loop
                loopFunctionMask.set(f);
            }
            else
            {
                if ((consideredLoops & loopFactors) == consideredLoops)
                {
                    dyn_bitset remainingLoops = loopFactors & ~consideredLoops;
                    if (remainingLoops.any())
                    {
                        size_t next = remainingLoops.find_next(highestPosition);
                        if (next != boost::dynamic_bitset<>::npos)
                            nextLoops.set(next);
                        else
                        {
                            ERROR("We found a remaining Loop which is not higher " <<
                                  " than the highest considered loop?!\n");
                            exit(1);
                        }
                    }
                }
            }
        }
    }
    
    presentFunctions &= ~loopFunctionMask;
    
    // Then use the registrar to split the functions to their loops
    DependentLoop& depLoop = depListOfLoops[thisLoopID];
    if (loopFunctionMask.any())
        depLoop.functionMask.push_back({view_id, loopFunctionMask});
    
    // Recurse to the next loops
    for (size_t viewID=0; viewID < _qc->numberOfViews() + 1; ++viewID)
    {
        if (nextLoops[viewID])
        {
            dyn_bitset nextConsideredLoops = consideredLoops;
            nextConsideredLoops.set(viewID);

            if (outViewLoop[view_id][viewID])
            {
                ERROR("THERE IS A MISTAKE WITH NEXT CONSIDERED LOOPS IN DEP COMP\n");
                exit(1);
            }

            // TODO: check the next loops for the given DependentLoop
            // if any of them use the same loop -- then reuse this one

            bool found = false;
            size_t nextLoopID;
            for (const size_t& potNextLoop : depLoop.next)
            {
                if (depListOfLoops[potNextLoop].loopFactors == nextConsideredLoops)
                {
                    found = true;
                    nextLoopID = potNextLoop;
                }
            }

            if (!found)
            {
                nextLoopID = depListOfLoops.size();

                // otherwise add a new loop to the list with the correct loops and
                // loopVariable and then add this new loop to next of this loop
                DependentLoop newDepLoop(_qc->numberOfViews());
                newDepLoop.loopFactors = nextConsideredLoops;
                newDepLoop.loopVariable = viewID;

                // std::cout << "#########" << newDepLoop.loopFactors << std::endl;
                
                depListOfLoops.push_back(newDepLoop);

                // std::cout << depLoop.next.size() << std::endl;
                depListOfLoops[thisLoopID].next.push_back(nextLoopID);
            }

            prod_bitset branch =
                computeDependentLoops(view_id,presentFunctions,relationBag,
                                      contributingViews, varOrderBitset,
                                      addedOutLoops,nextLoopID);

            depListOfLoops[thisLoopID].branchFunctions |= branch;
        }
    }

    if (outViewLoop[view_id] == consideredLoops)
        depListOfLoops[thisLoopID].outView.set(view_id);

    if (consideredLoops == addedOutLoops && nonAddedOutLoops.any())
    {
        size_t nextOutLoop = nonAddedOutLoops.find_first();
        if (nextOutLoop != boost::dynamic_bitset<>::npos)
        {
            dyn_bitset nextConsideredLoops = consideredLoops;
            nextConsideredLoops.set(nextOutLoop);

            bool found = false;
            size_t nextLoopID;
            for (const size_t& potNextLoop : depLoop.next)
            {
                if (depListOfLoops[potNextLoop].loopFactors == nextConsideredLoops)
                {
                    found = true;
                    nextLoopID = potNextLoop;
                }
            }

            if (!found)
            {
                nextLoopID = depListOfLoops.size();

                // otherwise add a new loop to the list with the correct loops and
                // loopVariable and then add this new loop to next of this loop
                DependentLoop newDepLoop(_qc->numberOfViews());
                newDepLoop.loopFactors = nextConsideredLoops;
                newDepLoop.loopVariable = nextOutLoop;
                
                
                depListOfLoops.push_back(newDepLoop);

                depListOfLoops[thisLoopID].next.push_back(nextLoopID);
            }

            addedOutLoops.set(nextOutLoop);

            prod_bitset branch =                
                computeDependentLoops(view_id,presentFunctions,relationBag,
                                      contributingViews,varOrderBitset,
                                      addedOutLoops,nextLoopID);

            depListOfLoops[thisLoopID].branchFunctions |= branch;
        }
    }
    
    return depListOfLoops[thisLoopID].branchFunctions;
}